

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

void embree::avx512::InstanceArrayIntersectorK<8>::intersect
               (vbool<8>_conflict *valid_i,Precalculations *pre,RayHitK<8> *ray,
               RayQueryContext *context,Primitive_conflict4 *prim)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  RTCFormat RVar5;
  InstanceArray *this;
  RTCRayQueryContext *pRVar6;
  RawBufferView *pRVar7;
  char *pcVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined1 auVar13 [16];
  Accel *pAVar14;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  undefined8 unaff_R13;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  vfloat4 a0_2;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined4 uVar36;
  vfloat4 a0;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 in_ZMM2 [64];
  int iVar45;
  vfloat4 a0_1;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar67;
  float fVar68;
  vfloat4 a1;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  undefined1 auVar66 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  RayQueryContext newcontext;
  vint<8> mask;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_80 [2] [32];
  
  auVar23 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  a0_1.field_0 = in_ZMM3._0_16_;
  auVar22 = in_ZMM2._0_16_;
  bVar17 = valid_i->v;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar14 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (pAVar14 != (Accel *)0x0) {
    uVar1 = (this->super_Geometry).mask;
    auVar35._4_4_ = uVar1;
    auVar35._0_4_ = uVar1;
    auVar35._8_4_ = uVar1;
    auVar35._12_4_ = uVar1;
    auVar35._16_4_ = uVar1;
    auVar35._20_4_ = uVar1;
    auVar35._24_4_ = uVar1;
    auVar35._28_4_ = uVar1;
    uVar12 = vptestmd_avx512vl(auVar35,*(undefined1 (*) [32])(ray + 0x120));
    bVar17 = bVar17 & (byte)uVar12;
    if ((bVar17 != 0) && (pRVar6 = context->user, pRVar6->instID[0] == 0xffffffff)) {
      auVar18._8_8_ = 0;
      auVar18._0_4_ = prim->primID_;
      auVar18._4_4_ = prim->instID_;
      auVar18 = vprolq_avx512vl(auVar18,0x20);
      *pRVar6 = auVar18._0_8_;
      uVar15 = (ulong)prim->primID_;
      pRVar7 = (this->l2w_buf).items;
      RVar5 = pRVar7->format;
      if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
        if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar16 = uVar15 * pRVar7->stride;
          auVar22 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x10)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar22,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x20)),0x28);
          auVar22 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16 + 4)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x14)),0x1c);
          auVar23 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x24)),0x28);
          auVar22 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16 + 8)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x18)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar22,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x28)),0x28);
          auVar22 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x1c)),0x1c);
          auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x2c)),0x28);
        }
        else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar16 = uVar15 * pRVar7->stride;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(pcVar8 + lVar16 + 4);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x10);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar16)),_DAT_01fbb140,auVar23)
          ;
          auVar23 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0xc)),_DAT_01fbb140,
                                       auVar43);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x18)),_DAT_01fbb140
                                            ,auVar19);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x28);
          auVar22 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x24)),_DAT_01fbb140,
                                       auVar20);
        }
        else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar16 = uVar15 * pRVar7->stride;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x10);
          auVar23 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(pcVar8 + lVar16 + 8)),0x20);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x34);
          auVar18 = vpermt2ps_avx512vl(auVar39,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar8 + lVar16)));
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x1c);
          fVar62 = *(float *)(pcVar8 + lVar16 + 0x24);
          fVar67 = *(float *)(pcVar8 + lVar16 + 0x28);
          fVar68 = *(float *)(pcVar8 + lVar16 + 0x2c);
          auVar19 = vpermt2ps_avx512vl(auVar21,_DAT_01fbb150,
                                       ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x18)));
          fVar69 = *(float *)(pcVar8 + lVar16 + 0x30);
          auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * fVar67)),ZEXT416((uint)fVar62),
                                    ZEXT416((uint)fVar62));
          auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar68),ZEXT416((uint)fVar68));
          auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
          auVar20 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar22._0_4_));
          fVar54 = auVar20._0_4_;
          fVar54 = fVar54 * 1.5 + fVar54 * fVar54 * fVar54 * auVar22._0_4_ * -0.5;
          auVar22 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar54 * fVar62)),0x30);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar18,ZEXT416((uint)(fVar54 * fVar67)),0x30);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar23,ZEXT416((uint)(fVar54 * fVar69)),0x30);
          auVar23 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar16 + 4)),0x10);
          auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x3c)),0x20);
          auVar23 = vinsertps_avx(auVar23,ZEXT416((uint)(fVar68 * fVar54)),0x30);
        }
        else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar16 = uVar15 * pRVar7->stride;
          a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar8 + lVar16))->v;
          auVar23 = *(undefined1 (*) [16])(pcVar8 + lVar16 + 0x10);
          a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                          ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar8 + lVar16 + 0x20)
                          )->v;
          auVar22 = *(undefined1 (*) [16])(pcVar8 + lVar16 + 0x30);
        }
        auVar18 = vshufps_avx(auVar22,auVar22,0xff);
        auVar20 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
        auVar43 = vshufps_avx(auVar23,auVar23,0xff);
        auVar26 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
        auVar19 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])0x0,0xe9);
        auVar19 = vblendps_avx(auVar19,auVar23,4);
        fVar58 = auVar20._0_4_;
        auVar39 = vfmadd213ss_fma(auVar18,auVar18,ZEXT416((uint)(fVar58 * fVar58)));
        auVar39 = vfnmadd231ss_fma(auVar39,auVar43,auVar43);
        auVar21 = vfnmadd231ss_fma(auVar39,auVar26,auVar26);
        fVar54 = auVar18._0_4_;
        auVar24 = ZEXT416((uint)(auVar26._0_4_ * fVar54));
        auVar39 = vfmadd213ss_fma(auVar43,auVar20,auVar24);
        fVar62 = auVar39._0_4_ + auVar39._0_4_;
        auVar47 = ZEXT416((uint)(auVar43._0_4_ * fVar54));
        auVar39 = vfmsub213ss_fma(auVar26,auVar20,auVar47);
        fVar67 = auVar39._0_4_ + auVar39._0_4_;
        auVar39 = vfmsub231ss_fma(auVar24,auVar20,auVar43);
        fVar68 = auVar39._0_4_ + auVar39._0_4_;
        auVar39 = vfmsub231ss_fma(ZEXT416((uint)(fVar58 * fVar58)),auVar18,auVar18);
        auVar18 = vfmadd213ss_avx512f(auVar43,auVar43,auVar39);
        auVar24 = vfnmadd231ss_avx512f(auVar18,auVar26,auVar26);
        auVar18 = vfmadd213ss_avx512f(auVar26,auVar43,ZEXT416((uint)(fVar58 * fVar54)));
        auVar25 = vaddss_avx512f(auVar18,auVar18);
        auVar18 = vfmadd213ss_fma(auVar20,auVar26,auVar47);
        fVar69 = auVar18._0_4_ + auVar18._0_4_;
        auVar18 = vfmsub231ss_fma(ZEXT416((uint)(fVar58 * fVar54)),auVar43,auVar26);
        fVar54 = auVar18._0_4_ + auVar18._0_4_;
        auVar18 = vfnmadd231ss_fma(auVar39,auVar43,auVar43);
        auVar20 = vfmadd231ss_fma(auVar18,auVar26,auVar26);
        uVar36 = auVar21._0_4_;
        auVar63._4_4_ = uVar36;
        auVar63._0_4_ = uVar36;
        auVar63._8_4_ = uVar36;
        auVar63._12_4_ = uVar36;
        auVar70._4_4_ = fVar62;
        auVar70._0_4_ = fVar62;
        auVar70._8_4_ = fVar62;
        auVar70._12_4_ = fVar62;
        auVar74._0_4_ = fVar67 * 0.0;
        auVar74._4_4_ = fVar67 * 0.0;
        auVar74._8_4_ = fVar67 * 1.0;
        auVar74._12_4_ = fVar67 * 0.0;
        auVar39 = ZEXT816(0x3f80000000000000);
        auVar18 = vfmadd231ps_fma(auVar74,auVar39,auVar70);
        auVar21 = SUB6416(ZEXT464(0x3f800000),0);
        auVar43 = vfmadd231ps_fma(auVar18,auVar21,auVar63);
        auVar64._4_4_ = fVar68;
        auVar64._0_4_ = fVar68;
        auVar64._8_4_ = fVar68;
        auVar64._12_4_ = fVar68;
        auVar18 = vbroadcastss_avx512vl(auVar24);
        auVar26 = vbroadcastss_avx512vl(auVar25);
        auVar72._0_4_ = auVar26._0_4_ * 0.0;
        auVar72._4_4_ = auVar26._4_4_ * 0.0;
        auVar72._8_4_ = auVar26._8_4_ * 1.0;
        auVar72._12_4_ = auVar26._12_4_ * 0.0;
        auVar18 = vfmadd231ps_fma(auVar72,auVar39,auVar18);
        auVar26 = vfmadd231ps_fma(auVar18,auVar21,auVar64);
        auVar59._4_4_ = fVar69;
        auVar59._0_4_ = fVar69;
        auVar59._8_4_ = fVar69;
        auVar59._12_4_ = fVar69;
        auVar56._4_4_ = fVar54;
        auVar56._0_4_ = fVar54;
        auVar56._8_4_ = fVar54;
        auVar56._12_4_ = fVar54;
        fVar62 = auVar20._0_4_;
        auVar65._0_4_ = fVar62 * 0.0;
        auVar65._4_4_ = fVar62 * 0.0;
        auVar65._8_4_ = fVar62 * 1.0;
        auVar65._12_4_ = fVar62 * 0.0;
        auVar18 = vfmadd231ps_fma(auVar65,auVar39,auVar56);
        auVar18 = vfmadd231ps_fma(auVar18,auVar21,auVar59);
        auVar24._0_4_ = a0.field_0._0_4_;
        auVar24._4_4_ = auVar24._0_4_;
        auVar24._8_4_ = auVar24._0_4_;
        auVar24._12_4_ = auVar24._0_4_;
        fVar62 = auVar18._0_4_;
        auVar57._0_4_ = fVar62 * 0.0;
        fVar67 = auVar18._4_4_;
        auVar57._4_4_ = fVar67 * 0.0;
        fVar68 = auVar18._8_4_;
        auVar57._8_4_ = fVar68 * 0.0;
        fVar69 = auVar18._12_4_;
        auVar57._12_4_ = fVar69 * 0.0;
        auVar18 = vfmadd213ps_fma((undefined1  [16])0x0,auVar26,auVar57);
        auVar18 = vfmadd231ps_fma(auVar18,auVar43,auVar24);
        uVar36 = auVar23._0_4_;
        auVar60._4_4_ = uVar36;
        auVar60._0_4_ = uVar36;
        auVar60._8_4_ = uVar36;
        auVar60._12_4_ = uVar36;
        auVar23 = vshufps_avx(auVar23,auVar23,0x55);
        auVar23 = vfmadd213ps_fma(auVar23,auVar26,auVar57);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar23,auVar43,auVar60);
        iVar45 = a0_1.field_0._0_4_;
        auVar49._4_4_ = iVar45;
        auVar49._0_4_ = iVar45;
        auVar49._8_4_ = iVar45;
        auVar49._12_4_ = iVar45;
        auVar23 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
        auVar20 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
        auVar47._0_4_ = fVar62 * auVar20._0_4_;
        auVar47._4_4_ = fVar67 * auVar20._4_4_;
        auVar47._8_4_ = fVar68 * auVar20._8_4_;
        auVar47._12_4_ = fVar69 * auVar20._12_4_;
        auVar23 = vfmadd231ps_fma(auVar47,auVar26,auVar23);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar23,auVar43,auVar49);
        uVar36 = auVar22._0_4_;
        auVar50._4_4_ = uVar36;
        auVar50._0_4_ = uVar36;
        auVar50._8_4_ = uVar36;
        auVar50._12_4_ = uVar36;
        auVar23 = vshufps_avx(auVar22,auVar22,0x55);
        auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
        auVar25._0_4_ = fVar62 * auVar22._0_4_;
        auVar25._4_4_ = fVar67 * auVar22._4_4_;
        auVar25._8_4_ = fVar68 * auVar22._8_4_;
        auVar25._12_4_ = fVar69 * auVar22._12_4_;
        auVar22 = vfmadd231ps_fma(auVar25,auVar26,auVar23);
        auVar23 = vfmadd231ps_fma(auVar22,auVar43,auVar50);
        auVar22._0_4_ = auVar19._0_4_ + 0.0 + auVar23._0_4_;
        auVar22._4_4_ = auVar19._4_4_ + 0.0 + auVar23._4_4_;
        auVar22._8_4_ = auVar19._8_4_ + 0.0 + auVar23._8_4_;
        auVar22._12_4_ = auVar19._12_4_ + 0.0 + auVar23._12_4_;
      }
      else if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar16 = uVar15 * pRVar7->stride;
        auVar22 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16)),
                                ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x10)),0x1c);
        auVar18 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x20)),0x28);
        auVar22 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16 + 4)),
                                ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x14)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar22,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x24)),0x28);
        auVar22 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16 + 8)),
                                ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x18)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar22,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x28)),0x28);
        auVar22 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0xc)),
                                ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x1c)),0x1c);
        auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x2c)),0x28);
      }
      else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar16 = uVar15 * pRVar7->stride;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(pcVar8 + lVar16 + 4);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x10);
        auVar18 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar16)),_DAT_01fbb140,auVar40);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0xc)),_DAT_01fbb140,
                                        auVar46);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x18)),_DAT_01fbb140,
                                          auVar41);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x28);
        auVar22 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x24)),_DAT_01fbb140,
                                     auVar51);
      }
      else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar16 = uVar15 * pRVar7->stride;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x10);
        auVar23 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(pcVar8 + lVar16 + 8)),0x20);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x34);
        auVar18 = vpermt2ps_avx512vl(auVar33,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar8 + lVar16)));
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *(ulong *)(pcVar8 + lVar16 + 0x1c);
        fVar62 = *(float *)(pcVar8 + lVar16 + 0x24);
        fVar67 = *(float *)(pcVar8 + lVar16 + 0x28);
        fVar68 = *(float *)(pcVar8 + lVar16 + 0x2c);
        auVar19 = vpermt2ps_avx512vl(auVar52,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x18)));
        fVar69 = *(float *)(pcVar8 + lVar16 + 0x30);
        auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * fVar67)),ZEXT416((uint)fVar62),
                                  ZEXT416((uint)fVar62));
        auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar68),ZEXT416((uint)fVar68));
        auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
        auVar20 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar22._0_4_));
        fVar54 = auVar20._0_4_;
        fVar54 = fVar54 * 1.5 + fVar54 * fVar54 * fVar54 * auVar22._0_4_ * -0.5;
        auVar22 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar54 * fVar62)),0x30);
        auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)(fVar54 * fVar67)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar23,ZEXT416((uint)(fVar54 * fVar69)),0x30);
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar16 + 0xc)),
                                ZEXT416(*(uint *)(pcVar8 + lVar16 + 4)),0x10);
        auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(pcVar8 + lVar16 + 0x3c)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar23,ZEXT416((uint)(fVar68 * fVar54)),0x30);
      }
      else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar16 = uVar15 * pRVar7->stride;
        auVar18 = *(undefined1 (*) [16])(pcVar8 + lVar16);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar8 + lVar16 + 0x10))->v
        ;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar8 + lVar16 + 0x20))
                        ->v;
        auVar22 = *(undefined1 (*) [16])(pcVar8 + lVar16 + 0x30);
      }
      auVar23 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
      auVar19 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
      auVar55._0_4_ = a0_1.field_0._0_4_ * auVar19._0_4_;
      auVar55._4_4_ = a0_1.field_0._4_4_ * auVar19._4_4_;
      auVar55._8_4_ = a0_1.field_0._8_4_ * auVar19._8_4_;
      auVar55._12_4_ = a0_1.field_0._12_4_ * auVar19._12_4_;
      auVar26 = vfmsub231ps_fma(auVar55,(undefined1  [16])a0.field_0,auVar23);
      auVar20 = vshufps_avx(auVar26,auVar26,0xc9);
      auVar43 = vshufps_avx(auVar18,auVar18,0xc9);
      auVar48._0_4_ = auVar18._0_4_ * auVar23._0_4_;
      auVar48._4_4_ = auVar18._4_4_ * auVar23._4_4_;
      auVar48._8_4_ = auVar18._8_4_ * auVar23._8_4_;
      auVar48._12_4_ = auVar18._12_4_ * auVar23._12_4_;
      auVar39 = vfmsub231ps_fma(auVar48,auVar43,(undefined1  [16])a0_1.field_0);
      auVar37._0_4_ = auVar43._0_4_ * a0.field_0._0_4_;
      auVar37._4_4_ = auVar43._4_4_ * a0.field_0._4_4_;
      auVar37._8_4_ = auVar43._8_4_ * a0.field_0._8_4_;
      auVar37._12_4_ = auVar43._12_4_ * a0.field_0._12_4_;
      auVar23 = vfmsub231ps_fma(auVar37,auVar18,auVar19);
      auVar21 = vpermi2ps_avx512vl(_DAT_01fbec70,auVar20,auVar23);
      auVar19 = vunpcklps_avx(auVar26,auVar23);
      auVar23 = vinsertps_avx(auVar39,auVar39,0x4a);
      auVar43 = vunpcklps_avx(auVar19,ZEXT416(auVar39._0_4_));
      auVar26 = vunpcklps_avx(auVar21,auVar23);
      auVar19 = vunpckhps_avx(auVar21,auVar23);
      auVar23 = vdpps_avx(auVar18,auVar20,0x7f);
      auVar34._0_4_ = auVar23._0_4_;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      auVar23 = vdivps_avx(auVar26,auVar34);
      auVar18 = vdivps_avx(auVar19,auVar34);
      auVar19 = vdivps_avx(auVar43,auVar34);
      uVar36 = auVar22._0_4_;
      auVar38._4_4_ = uVar36;
      auVar38._0_4_ = uVar36;
      auVar38._8_4_ = uVar36;
      auVar38._12_4_ = uVar36;
      auVar20 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      fVar62 = auVar19._0_4_;
      auVar42._0_4_ = auVar22._0_4_ * fVar62;
      auVar42._4_4_ = auVar22._4_4_ * auVar19._4_4_;
      auVar42._8_4_ = auVar22._8_4_ * auVar19._8_4_;
      auVar42._12_4_ = auVar22._12_4_ * auVar19._12_4_;
      auVar22 = vfmadd231ps_fma(auVar42,auVar18,auVar20);
      auVar22 = vfmadd231ps_fma(auVar22,auVar23,auVar38);
      auVar13._8_4_ = 0x80000000;
      auVar13._0_8_ = 0x8000000080000000;
      auVar13._12_4_ = 0x80000000;
      auVar22 = vxorps_avx512vl(auVar22,auVar13);
      auVar44._8_4_ = 1;
      auVar44._0_8_ = 0x100000001;
      auVar44._12_4_ = 1;
      auVar44._16_4_ = 1;
      auVar44._20_4_ = 1;
      auVar44._24_4_ = 1;
      auVar44._28_4_ = 1;
      uVar36 = auVar23._0_4_;
      auVar53._4_4_ = uVar36;
      auVar53._0_4_ = uVar36;
      auVar53._8_4_ = uVar36;
      auVar53._12_4_ = uVar36;
      auVar53._16_4_ = uVar36;
      auVar53._20_4_ = uVar36;
      auVar53._24_4_ = uVar36;
      auVar53._28_4_ = uVar36;
      auVar9 = vpermps_avx2(auVar44,ZEXT1632(auVar23));
      auVar61._8_4_ = 2;
      auVar61._0_8_ = 0x200000002;
      auVar61._12_4_ = 2;
      auVar61._16_4_ = 2;
      auVar61._20_4_ = 2;
      auVar61._24_4_ = 2;
      auVar61._28_4_ = 2;
      auVar10 = vpermps_avx2(auVar61,ZEXT1632(auVar23));
      uVar36 = auVar18._0_4_;
      auVar66._4_4_ = uVar36;
      auVar66._0_4_ = uVar36;
      auVar66._8_4_ = uVar36;
      auVar66._12_4_ = uVar36;
      auVar66._16_4_ = uVar36;
      auVar66._20_4_ = uVar36;
      auVar66._24_4_ = uVar36;
      auVar66._28_4_ = uVar36;
      auVar30 = vpermps_avx2(auVar44,ZEXT1632(auVar18));
      auVar31 = vpermps_avx2(auVar61,ZEXT1632(auVar18));
      auVar71._4_4_ = fVar62;
      auVar71._0_4_ = fVar62;
      auVar71._8_4_ = fVar62;
      auVar71._12_4_ = fVar62;
      auVar71._16_4_ = fVar62;
      auVar71._20_4_ = fVar62;
      auVar71._24_4_ = fVar62;
      auVar71._28_4_ = fVar62;
      auVar28 = vpermps_avx2(auVar44,ZEXT1632(auVar19));
      auVar29 = vpermps_avx2(auVar61,ZEXT1632(auVar19));
      uVar36 = auVar22._0_4_;
      auVar73._4_4_ = uVar36;
      auVar73._0_4_ = uVar36;
      auVar73._8_4_ = uVar36;
      auVar73._12_4_ = uVar36;
      auVar73._16_4_ = uVar36;
      auVar73._20_4_ = uVar36;
      auVar73._24_4_ = uVar36;
      auVar73._28_4_ = uVar36;
      auVar27 = vpermps_avx2(auVar44,ZEXT1632(auVar22));
      auVar11 = vpermps_avx2(auVar61,ZEXT1632(auVar22));
      auVar35 = *(undefined1 (*) [32])ray;
      auVar44 = *(undefined1 (*) [32])(ray + 0x20);
      auVar61 = *(undefined1 (*) [32])(ray + 0x40);
      auVar2 = *(undefined1 (*) [32])(ray + 0x80);
      auVar3 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar4 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar22 = vfmadd231ps_fma(auVar73,auVar61,auVar71);
      auVar23 = vfmadd231ps_fma(auVar27,auVar61,auVar28);
      auVar18 = vfmadd231ps_fma(auVar11,auVar61,auVar29);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar44,auVar66);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar44,auVar30);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar44,auVar31);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar35,auVar53);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar35,auVar9);
      *(undefined1 (*) [32])ray = ZEXT1632(auVar22);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar35,auVar10);
      *(undefined1 (*) [32])(ray + 0x20) = ZEXT1632(auVar23);
      *(undefined1 (*) [32])(ray + 0x40) = ZEXT1632(auVar22);
      auVar27 = vmulps_avx512vl(auVar4,auVar71);
      auVar28 = vmulps_avx512vl(auVar4,auVar28);
      auVar29 = vmulps_avx512vl(auVar4,auVar29);
      auVar27 = vfmadd231ps_avx512vl(auVar27,auVar3,auVar66);
      auVar30 = vfmadd231ps_avx512vl(auVar28,auVar3,auVar30);
      auVar31 = vfmadd231ps_avx512vl(auVar29,auVar3,auVar31);
      auVar22 = vfmadd231ps_fma(auVar27,auVar2,auVar53);
      auVar23 = vfmadd231ps_fma(auVar30,auVar2,auVar9);
      auVar18 = vfmadd231ps_fma(auVar31,auVar2,auVar10);
      *(undefined1 (*) [32])(ray + 0x80) = ZEXT1632(auVar22);
      *(undefined1 (*) [32])(ray + 0xa0) = ZEXT1632(auVar23);
      *(undefined1 (*) [32])(ray + 0xc0) = ZEXT1632(auVar18);
      local_80[0] = vpmovm2d_avx512vl(CONCAT71((int7)((ulong)unaff_R13 >> 8),bVar17) & 0xffffffff);
      (**(code **)&pAVar14->field_0xe0)(local_80,&(pAVar14->super_AccelData).field_0x58,ray);
      local_100 = auVar35._0_8_;
      uStack_f8 = auVar35._8_8_;
      uStack_f0 = auVar35._16_8_;
      uStack_e8 = auVar35._24_8_;
      *(undefined8 *)ray = local_100;
      *(undefined8 *)(ray + 8) = uStack_f8;
      *(undefined8 *)(ray + 0x10) = uStack_f0;
      *(undefined8 *)(ray + 0x18) = uStack_e8;
      local_e0 = auVar44._0_8_;
      uStack_d8 = auVar44._8_8_;
      uStack_d0 = auVar44._16_8_;
      uStack_c8 = auVar44._24_8_;
      *(undefined8 *)(ray + 0x20) = local_e0;
      *(undefined8 *)(ray + 0x28) = uStack_d8;
      *(undefined8 *)(ray + 0x30) = uStack_d0;
      *(undefined8 *)(ray + 0x38) = uStack_c8;
      local_c0 = auVar61._0_8_;
      uStack_b8 = auVar61._8_8_;
      uStack_b0 = auVar61._16_8_;
      uStack_a8 = auVar61._24_8_;
      *(undefined8 *)(ray + 0x40) = local_c0;
      *(undefined8 *)(ray + 0x48) = uStack_b8;
      *(undefined8 *)(ray + 0x50) = uStack_b0;
      *(undefined8 *)(ray + 0x58) = uStack_a8;
      local_160 = auVar2._0_8_;
      uStack_158 = auVar2._8_8_;
      uStack_150 = auVar2._16_8_;
      uStack_148 = auVar2._24_8_;
      *(undefined8 *)(ray + 0x80) = local_160;
      *(undefined8 *)(ray + 0x88) = uStack_158;
      *(undefined8 *)(ray + 0x90) = uStack_150;
      *(undefined8 *)(ray + 0x98) = uStack_148;
      local_140 = auVar3._0_8_;
      uStack_138 = auVar3._8_8_;
      uStack_130 = auVar3._16_8_;
      uStack_128 = auVar3._24_8_;
      *(undefined8 *)(ray + 0xa0) = local_140;
      *(undefined8 *)(ray + 0xa8) = uStack_138;
      *(undefined8 *)(ray + 0xb0) = uStack_130;
      *(undefined8 *)(ray + 0xb8) = uStack_128;
      local_120 = auVar4._0_8_;
      uStack_118 = auVar4._8_8_;
      uStack_110 = auVar4._16_8_;
      uStack_108 = auVar4._24_8_;
      *(undefined8 *)(ray + 0xc0) = local_120;
      *(undefined8 *)(ray + 200) = uStack_118;
      *(undefined8 *)(ray + 0xd0) = uStack_110;
      *(undefined8 *)(ray + 0xd8) = uStack_108;
      pRVar6->instID[0] = 0xffffffff;
      pRVar6->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorK<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3vf<K> world2local = instance->getWorld2Local(prim.primID_);
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }